

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  
  uVar2 = this->size_;
  if (uVar2 == 0) {
    return 0xffffffffffffffff;
  }
  do {
    uVar5 = pos;
    pos = uVar2 - 1;
  } while (uVar2 <= uVar5);
  pcVar3 = this->data_;
  pcVar6 = pcVar3 + uVar5 + 1;
  while (pcVar4 = pcVar6, pcVar6 = pcVar3, pcVar4 != pcVar3) {
    sVar7 = 0;
    while (pcVar6 = pcVar4 + -1, v.size_ != sVar7) {
      pcVar1 = v.data_ + sVar7;
      pcVar6 = pcVar4;
      sVar7 = sVar7 + 1;
      if (pcVar4[-1] == *pcVar1) goto LAB_0019ee67;
    }
  }
LAB_0019ee67:
  pcVar4 = (char *)0xffffffffffffffff;
  if (pcVar6 != pcVar3) {
    pcVar4 = pcVar6 + ~(ulong)pcVar3;
  }
  return (size_type)pcVar4;
}

Assistant:

nssv_constexpr size_type find_last_of( basic_string_view v, size_type pos = npos ) const nssv_noexcept  // (1)
    {
        return empty()
            ? npos
            : pos >= size()
            ? find_last_of( v, size() - 1 )
            : to_pos( std::find_first_of( const_reverse_iterator( cbegin() + pos + 1 ), crend(), v.cbegin(), v.cend(), Traits::eq ) );
    }